

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int send_attach(LINK_INSTANCE *link,char *name,handle handle,role role)

{
  int iVar1;
  ATTACH_HANDLE attach_00;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  ATTACH_HANDLE attach;
  int result;
  role role_local;
  handle handle_local;
  char *name_local;
  LINK_INSTANCE *link_local;
  
  attach_00 = attach_create(name,handle,role);
  if (attach_00 == (ATTACH_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"send_attach",0x109,1,"NULL attach performative");
    }
    attach._4_4_ = 0x10a;
  }
  else {
    attach._4_4_ = 0;
    link->delivery_count = link->initial_delivery_count;
    attach_set_snd_settle_mode(attach_00,link->snd_settle_mode);
    attach_set_rcv_settle_mode(attach_00,link->rcv_settle_mode);
    attach_set_role(attach_00,role);
    attach_set_source(attach_00,link->source);
    attach_set_target(attach_00,link->target);
    if (link->attach_properties != (fields)0x0) {
      attach_set_properties(attach_00,link->attach_properties);
    }
    if ((!role) &&
       (iVar1 = attach_set_initial_delivery_count(attach_00,link->delivery_count), iVar1 != 0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"send_attach",0x120,1,"Cannot set attach initial delivery count");
      }
      attach._4_4_ = 0x121;
    }
    if (attach._4_4_ == 0) {
      iVar1 = attach_set_max_message_size(attach_00,link->max_message_size);
      if (iVar1 == 0) {
        iVar1 = session_send_attach(link->link_endpoint,attach_00);
        if (iVar1 == 0) {
          attach._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                      ,"send_attach",0x12e,1,"Sending attach failed in session send");
          }
          attach._4_4_ = 0x12f;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                    ,"send_attach",0x129,1,"Cannot set max message size");
        }
        attach._4_4_ = 0x12a;
      }
    }
    attach_destroy(attach_00);
  }
  return attach._4_4_;
}

Assistant:

static int send_attach(LINK_INSTANCE* link, const char* name, handle handle, role role)
{
    int result;
    ATTACH_HANDLE attach = attach_create(name, handle, role);

    if (attach == NULL)
    {
        LogError("NULL attach performative");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;

        link->delivery_count = link->initial_delivery_count;

        attach_set_snd_settle_mode(attach, link->snd_settle_mode);
        attach_set_rcv_settle_mode(attach, link->rcv_settle_mode);
        attach_set_role(attach, role);
        attach_set_source(attach, link->source);
        attach_set_target(attach, link->target);
        if (link->attach_properties != NULL)
        {
            (void)attach_set_properties(attach, link->attach_properties);
        }

        if (role == role_sender)
        {
            if (attach_set_initial_delivery_count(attach, link->delivery_count) != 0)
            {
                LogError("Cannot set attach initial delivery count");
                result = MU_FAILURE;
            }
        }

        if (result == 0)
        {
            if (attach_set_max_message_size(attach, link->max_message_size) != 0)
            {
                LogError("Cannot set max message size");
                result = MU_FAILURE;
            }
            else if (session_send_attach(link->link_endpoint, attach) != 0)
            {
                LogError("Sending attach failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }

        attach_destroy(attach);
    }

    return result;
}